

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O1

void __thiscall SubprocessTestInterruptParent::Run(SubprocessTestInterruptParent *this)

{
  bool bVar1;
  Subprocess *this_00;
  SubprocessSet *this_01;
  string local_38;
  
  this_01 = &(this->super_SubprocessTest).subprocs_;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"kill -INT $PPID ; sleep 1","");
  this_00 = SubprocessSet::Add(this_01,&local_38,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  bVar1 = testing::Test::Check
                    (g_current_test,this_00 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                     ,0x5a,"(Subprocess *) 0 != subproc");
  if (bVar1) {
    do {
      bVar1 = Subprocess::Done(this_00);
      if (bVar1) {
        bVar1 = testing::Test::Check
                          (g_current_test,false,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                           ,0x62,"\"We should have been interrupted\"");
        if (bVar1) {
          return;
        }
        goto LAB_0017760a;
      }
      bVar1 = SubprocessSet::DoWork(this_01);
    } while (!bVar1);
  }
  else {
LAB_0017760a:
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, InterruptParent) {
  Subprocess* subproc = subprocs_.Add("kill -INT $PPID ; sleep 1");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    bool interrupted = subprocs_.DoWork();
    if (interrupted)
      return;
  }

  ASSERT_FALSE("We should have been interrupted");
}